

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

float Map_MappingGetArea(Map_Man_t *pMan)

{
  Map_Node_t *p;
  Map_Super_t *pMVar1;
  int iVar2;
  long lVar3;
  float local_1c;
  
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  local_1c = 0.0;
  lVar3 = 0;
  do {
    if (pMan->vMapObjs->nSize <= lVar3) {
      for (lVar3 = 0; lVar3 < pMan->nOutputs; lVar3 = lVar3 + 1) {
        iVar2 = Map_NodeIsVar(pMan->pOutputs[lVar3]);
        if ((iVar2 != 0) && (((ulong)pMan->pOutputs[lVar3] & 1) == 0)) {
          local_1c = local_1c + pMan->pSuperLib->AreaBuf;
        }
      }
      return local_1c;
    }
    p = pMan->vMapObjs->pArray[lVar3];
    if ((p->nRefAct[2] != 0) && (iVar2 = Map_NodeIsBuf(p), iVar2 == 0)) {
      if ((p->pCutBest[0] == (Map_Cut_t *)0x0) && (p->pCutBest[1] == (Map_Cut_t *)0x0)) {
        __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                      ,500,"float Map_MappingGetArea(Map_Man_t *)");
      }
      if ((p->nRefAct[0] < 1) && (p->nRefAct[1] < 1)) {
        __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                      ,0x1f6,"float Map_MappingGetArea(Map_Man_t *)");
      }
      iVar2 = Map_NodeIsAnd(p);
      if (iVar2 == 0) {
LAB_00367413:
        if ((p->pCutBest[0] != (Map_Cut_t *)0x0) || (p->nRefAct[0] < 1)) goto LAB_0036741d;
      }
      else {
        if ((p->pCutBest[0] != (Map_Cut_t *)0x0) &&
           ((0 < p->nRefAct[0] || (p->pCutBest[1] == (Map_Cut_t *)0x0)))) {
          pMVar1 = p->pCutBest[0]->M[0].pSuperBest;
          local_1c = local_1c + pMVar1->Area;
          if (pMan->fUseProfile != 0) {
            Mio_GateIncProfile2(pMVar1->pRoot);
          }
        }
        if (p->pCutBest[1] == (Map_Cut_t *)0x0) goto LAB_00367413;
        if ((0 < p->nRefAct[1]) || (p->pCutBest[0] == (Map_Cut_t *)0x0)) {
          pMVar1 = p->pCutBest[1]->M[1].pSuperBest;
          local_1c = local_1c + pMVar1->Area;
          if (pMan->fUseProfile != 0) {
            Mio_GateIncProfile2(pMVar1->pRoot);
          }
          goto LAB_00367413;
        }
LAB_0036741d:
        if ((p->pCutBest[1] != (Map_Cut_t *)0x0) || (p->nRefAct[1] < 1)) goto LAB_00367452;
      }
      local_1c = local_1c + pMan->pSuperLib->AreaInv;
    }
LAB_00367452:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

float Map_MappingGetArea( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    float Area = 0.0;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        if ( Map_NodeIsBuf(pNode) )
            continue;
        // at least one phase has the best cut assigned
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // at least one phase is used in the mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );
        // compute the array due to the supergate
        if ( Map_NodeIsAnd(pNode) )
        {
            // count area of the negative phase
            if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
            {
                Area += pNode->pCutBest[0]->M[0].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[0]->M[0].pSuperBest->pRoot );
            }
            // count area of the positive phase
            if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
            {
                Area += pNode->pCutBest[1]->M[1].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[1]->M[1].pSuperBest->pRoot );
            }
        }
        // count area of the interver if we need to implement one phase with another phase
        if ( (pNode->pCutBest[0] == NULL && pNode->nRefAct[0] > 0) || 
             (pNode->pCutBest[1] == NULL && pNode->nRefAct[1] > 0) )
            Area += pMan->pSuperLib->AreaInv;
    }
    // add buffers for each CO driven by a CI
    for ( i = 0; i < pMan->nOutputs; i++ )
        if ( Map_NodeIsVar(pMan->pOutputs[i]) && !Map_IsComplement(pMan->pOutputs[i]) )
            Area += pMan->pSuperLib->AreaBuf;
    return Area;
}